

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

DynamicStackArray<embree::GeneralCatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>::Face,_16UL,_64UL>
* __thiscall
embree::
DynamicStackArray<embree::GeneralCatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>::Face,_16UL,_64UL>
::operator=(DynamicStackArray<embree::GeneralCatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>::Face,_16UL,_64UL>
            *this,DynamicStackArray<embree::GeneralCatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>::Face,_16UL,_64UL>
                  *other)

{
  size_t i;
  DynamicStackArray<embree::GeneralCatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>::Face,_16UL,_64UL>
  *pDVar1;
  Face *pFVar2;
  long lVar3;
  ulong uVar4;
  DynamicStackArray<embree::GeneralCatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>::Face,_16UL,_64UL>
  *pDVar5;
  ulong uVar6;
  
  pDVar5 = (DynamicStackArray<embree::GeneralCatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>::Face,_16UL,_64UL>
            *)other->data;
  uVar6 = 0;
  do {
    pDVar1 = (DynamicStackArray<embree::GeneralCatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>::Face,_16UL,_64UL>
              *)this->data;
    if ((0xf < uVar6) && (pDVar1 == this)) {
      pFVar2 = (Face *)operator_new__(0x200);
      this->data = pFVar2;
      lVar3 = 0;
      do {
        this->data[lVar3] = this->arr[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x10);
      pDVar1 = (DynamicStackArray<embree::GeneralCatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>::Face,_16UL,_64UL>
                *)this->data;
    }
    pDVar1->arr[uVar6] = pDVar5->arr[uVar6];
    uVar6 = uVar6 + 1;
    pDVar5 = (DynamicStackArray<embree::GeneralCatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>::Face,_16UL,_64UL>
              *)other->data;
    uVar4 = 0x40;
    if (pDVar5 == other) {
      uVar4 = 0x10;
    }
  } while (uVar6 < uVar4);
  return this;
}

Assistant:

DynamicStackArray& operator= (const DynamicStackArray& other)
    {
      for (size_t i=0; i<other.size(); i++)
        this->operator[] (i) = other[i];

      return *this;
    }